

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockComparatorCopierTest_customObjectParameterFailsWhenNotHavingAComparisonRepository_TestShell
::createTest(TEST_MockComparatorCopierTest_customObjectParameterFailsWhenNotHavingAComparisonRepository_TestShell
             *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
                                  ,0x52);
  TEST_MockComparatorCopierTest_customObjectParameterFailsWhenNotHavingAComparisonRepository_Test::
  TEST_MockComparatorCopierTest_customObjectParameterFailsWhenNotHavingAComparisonRepository_Test
            ((TEST_MockComparatorCopierTest_customObjectParameterFailsWhenNotHavingAComparisonRepository_Test
              *)this_00);
  return this_00;
}

Assistant:

TEST(MockComparatorCopierTest, customObjectParameterFailsWhenNotHavingAComparisonRepository)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MyTypeForTesting object(1);
    mock().expectOneCall("function").withParameterOfType("MyTypeForTesting", "parameterName", &object);
    mock().actualCall("function").withParameterOfType("MyTypeForTesting", "parameterName", &object);

    MockNoWayToCompareCustomTypeFailure expectedFailure(mockFailureTest(), "MyTypeForTesting");
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}